

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.h
# Opt level: O2

void __thiscall
dynamicgraph::SignalPtr<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::SignalPtr
          (SignalPtr<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this,
          Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *ptr,string *name)

{
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::Signal
            ((Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)&this->field_0x28,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  this->_vptr_SignalPtr = (_func_int **)0x1359e8;
  *(undefined8 *)&this->field_0x28 = 0x135bb8;
  this->signalPtr = ptr;
  this->modeNoThrow = false;
  this->transmitAbstract = false;
  this->abstractTransmitter = (SignalBase<int> *)0x0;
  return;
}

Assistant:

SignalPtr(Signal<T, Time> *ptr, std::string name = "")
      : Signal<T, Time>(name),
        signalPtr(ptr),
        modeNoThrow(false),
        transmitAbstract(false),
        abstractTransmitter(NULL) {}